

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

int xercesc_4_0::XMLUri::scanHexSequence(XMLCh *addr,XMLSize_t index,XMLSize_t end,int *counter)

{
  ulong uVar1;
  XMLCh theChar;
  int iVar2;
  bool bVar3;
  ulong uVar4;
  uint uVar5;
  int iVar6;
  
  uVar5 = 0;
  uVar1 = index;
  while( true ) {
    while( true ) {
      uVar4 = uVar1;
      if (end <= uVar4) {
        if ((int)uVar5 < 1) {
          return -1;
        }
        iVar6 = *counter;
        *counter = iVar6 + 1;
        if (7 < iVar6) {
          return -1;
        }
        return (int)end;
      }
      theChar = addr[uVar4];
      iVar6 = (int)uVar4;
      if (theChar != L':') break;
      if ((int)uVar5 < 1) {
        if (uVar5 == 0) {
          return iVar6;
        }
      }
      else {
        iVar2 = *counter;
        *counter = iVar2 + 1;
        if (7 < iVar2) {
          return -1;
        }
      }
      uVar1 = uVar4 + 1;
      uVar5 = 0;
      if ((uVar1 < end) && (uVar5 = 0, addr[uVar4 + 1] == L':')) {
        return iVar6;
      }
    }
    bVar3 = XMLString::isHex(theChar);
    if (!bVar3) break;
    if (3 < (int)uVar5) {
      return -1;
    }
    uVar5 = uVar5 + 1;
    uVar1 = uVar4 + 1;
  }
  if (2 < uVar5 - 1) {
    return -1;
  }
  if (theChar != L'.') {
    return -1;
  }
  if (6 < *counter) {
    return -1;
  }
  if ((int)index < (int)(~uVar5 + iVar6)) {
    return ~uVar5 + iVar6;
  }
  return (int)index;
}

Assistant:

int XMLUri::scanHexSequence (const XMLCh* const addr, XMLSize_t index, XMLSize_t end, int& counter)
{
    XMLCh testChar = chNull;
    int numDigits = 0;
    XMLSize_t start = index;

    // Trying to match the following productions:
    // hexseq = hex4 *( ":" hex4)
    // hex4   = 1*4HEXDIG
    for (; index < end; ++index)
    {
      	testChar = addr[index];
      	if (testChar == chColon)
      	{
      	    // IPv6 addresses are 128-bit, so there can be at most eight sections.
      	    if (numDigits > 0 && ++counter > 8)
      	    {
      	        return -1;
      	    }
      	    // This could be '::'.
      	    if (numDigits == 0 || ((index+1 < end) && addr[index+1] == chColon))
      	    {
      	        return (int)index;
      	    }
      	    numDigits = 0;
        }
        // This might be invalid or an IPv4address. If it's potentially an IPv4address,
        // backup to just after the last valid character that matches hexseq.
        else if (!XMLString::isHex(testChar))
        {
            if (testChar == chPeriod && numDigits < 4 && numDigits > 0 && counter <= 6)
            {
                int back = (int)index - numDigits - 1;
                return (back >= (int)start) ? back : (int)start;
            }
            return -1;
        }
        // There can be at most 4 hex digits per group.
        else if (++numDigits > 4)
        {
            return -1;
        }
    }
    return (numDigits > 0 && ++counter <= 8) ? (int)end : -1;
}